

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<double,_std::allocator<double>_> start;
  maze_s final;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  GRID;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> show_path;
  HBF hbf;
  maze_path get_path;
  pointer in_stack_fffffffffffffe98;
  pointer in_stack_fffffffffffffea0;
  pointer in_stack_fffffffffffffea8;
  pointer in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  pointer in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> local_118;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  HBF local_a0;
  maze_path local_80;
  
  makeBlankGrid((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&stack0xfffffffffffffe98,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Finding path through grid:",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (in_stack_fffffffffffffea0 != in_stack_fffffffffffffe98) {
    uVar8 = 0;
    do {
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 *in_stack_fffffffffffffe98[uVar8].super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start);
      if (4 < (ulong)((long)(in_stack_fffffffffffffe98->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(in_stack_fffffffffffffe98->super__Vector_base<int,_std::allocator<int>_>
                           )._M_impl.super__Vector_impl_data._M_start)) {
        uVar6 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
          std::ostream::operator<<
                    ((ostream *)&std::cout,
                     in_stack_fffffffffffffe98[uVar8].super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)(in_stack_fffffffffffffe98->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(in_stack_fffffffffffffe98->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      uVar8 = uVar8 + 1;
      uVar6 = ((long)in_stack_fffffffffffffea0 - (long)in_stack_fffffffffffffe98 >> 3) *
              -0x5555555555555555;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  HBF::HBF(&local_a0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b8,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&stack0xfffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::vector(&local_d0,&START);
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,&GOAL);
  HBF::search(&local_80,&local_a0,&local_b8,&local_d0,&local_e8);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&local_100,&local_80.came_from);
  std::vector<double,_std::allocator<double>_>::vector(&local_118,&START);
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80.final.x;
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80.final.g;
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_80.final.y;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffe98;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_80.final.theta;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffea0;
  final.x = (double)in_stack_fffffffffffffeb0;
  final.g = (double)in_stack_fffffffffffffea8;
  final.y = (double)in_stack_fffffffffffffeb8;
  final.theta = (double)in_stack_fffffffffffffec0;
  HBF::reconstruct_path
            ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)&stack0xfffffffffffffeb0,&local_a0
             ,came_from,start,final);
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"steps: ",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"show path from start to finish",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  uVar8 = (ulong)((long)in_stack_fffffffffffffeb8 - (long)in_stack_fffffffffffffeb0) >> 5 &
          0xffffffff;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) break;
    uVar7 = (uint)uVar8 & 0x7fffffff;
    dVar1 = in_stack_fffffffffffffeb0[uVar7].g;
    dVar2 = in_stack_fffffffffffffeb0[uVar7].x;
    dVar3 = in_stack_fffffffffffffeb0[uVar7].y;
    dVar4 = in_stack_fffffffffffffeb0[uVar7].theta;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##### step ",0xb);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," #####",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"g ",2);
    poVar5 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x ",2);
    poVar5 = std::ostream::_M_insert<double>(dVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y ",2);
    poVar5 = std::ostream::_M_insert<double>(dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"theta ",6);
    poVar5 = std::ostream::_M_insert<double>(dVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (in_stack_fffffffffffffeb0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffeb0);
  }
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_80.came_from);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_80.closed);
  HBF::~HBF(&local_a0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&stack0xfffffffffffffe98);
  return 0;
}

Assistant:

int main() {

    vector< vector<int> > GRID = makeBlankGrid(16);

    cout << "Finding path through grid:" << endl;

    // TODO:: Create an Empty Maze and try testing the number of expansions with it

    for (int i = 0; i < GRID.size(); i++) {
        cout << GRID[i][0];
        for (int j = 1; j < GRID[0].size(); j++) {
            cout << "," << GRID[i][j];
        }
        cout << endl;
    }

    HBF hbf = HBF();

//    vector<vector<double> > heuristic = hbf.heuristic_basic(GRID, START, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_euclidean(GRID, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_manhattan(GRID, GOAL);

/*    cout << "Check my heuristic function. " << endl;
    for (int i = 0; i < heuristic.size(); i++) {
        cout << heuristic[i][0];
        for (int j = 1; j < heuristic[0].size(); j++) {
            cout << "," << heuristic[i][j];
        }
        cout << endl;
    }*/

    HBF::maze_path get_path = hbf.search(GRID, START, GOAL);

    vector<HBF::maze_s> show_path = hbf.reconstruct_path(get_path.came_from, START, get_path.final);

    cout << "steps: " <<show_path.size() << endl;
    cout << "show path from start to finish" << endl;
    for (int i = show_path.size() - 1; i >= 0; i--) {

        HBF::maze_s step = show_path[i];
        cout << "##### step " << show_path.size()-i << " #####" << endl;
        cout << "g " << step.g << endl;
        cout << "x " << step.x << endl;
        cout << "y " << step.y << endl;
        cout << "theta " << step.theta << endl;

    }

    return 0;
}